

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall aiAnimMesh::aiAnimMesh(aiAnimMesh *this)

{
  uint a_1;
  uint a;
  long lVar1;
  
  (this->mName).length = 0;
  (this->mName).data[0] = '\0';
  memset((this->mName).data + 1,0x1b,0x3ff);
  memset(&this->mVertices,0,0xa8);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->mTextureCoords[lVar1] = (aiVector3D *)0x0;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->mColors[lVar1] = (aiColor4D *)0x0;
  }
  return;
}

Assistant:

aiAnimMesh() AI_NO_EXCEPT
        : mVertices( nullptr )
        , mNormals(nullptr)
        , mTangents(nullptr)
        , mBitangents(nullptr)
        , mColors()
        , mTextureCoords()
        , mNumVertices( 0 )
        , mWeight( 0.0f )
    {
        // fixme consider moving this to the ctor initializer list as well
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++){
            mTextureCoords[a] = nullptr;
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            mColors[a] = nullptr;
        }
    }